

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O1

int ConnectHokuyo(HOKUYO *pHokuyo,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  ssize_t sVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  char Sum;
  int Status;
  int ivalue;
  char line [256];
  char recvbuf [8192];
  undefined4 local_41ac;
  char local_41a8;
  char local_41a7;
  int *local_40a0;
  BOOL *local_4098;
  BOOL *local_4090;
  BOOL *local_4088;
  int *local_4080;
  int *local_4078;
  int *local_4070;
  int *local_4068;
  int *local_4060;
  int *local_4058;
  BOOL *local_4050;
  double *local_4048;
  double *local_4040;
  undefined5 local_4038;
  undefined4 uStack_4033;
  undefined4 uStack_402f;
  undefined8 local_2038;
  undefined1 local_2030;
  undefined1 local_202f [8191];
  
  local_41ac = 0;
  memset(pHokuyo->szCfgFilePath,0,0x100);
  sprintf(pHokuyo->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_41a8,0,0x100);
    memset(pHokuyo->szDevPath + 5,0,0xfb);
    builtin_strncpy(pHokuyo->szDevPath,"COM1",5);
    pHokuyo->BaudRate = 0x1c200;
    pHokuyo->timeout = 1000;
    pHokuyo->threadperiod = 100;
    pHokuyo->bSaveRawData = 1;
    pHokuyo->bForceSCIP20 = 0;
    pHokuyo->bHS = 0;
    pHokuyo->SlitDivision = 0x400;
    pHokuyo->StartingStep = 0x2c;
    pHokuyo->FrontStep = 0x180;
    pHokuyo->EndStep = 0x2d5;
    pHokuyo->ClusterCount = 0;
    pHokuyo->ScanInterval = 0;
    pHokuyo->bContinuousNumberOfScans = 1;
    pHokuyo->alpha_max_err = 0.01;
    pHokuyo->d_max_err = 0.1;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      local_40a0 = &pHokuyo->threadperiod;
      local_4098 = &pHokuyo->bSaveRawData;
      local_4090 = &pHokuyo->bForceSCIP20;
      local_4088 = &pHokuyo->bHS;
      local_4080 = &pHokuyo->SlitDivision;
      local_4078 = &pHokuyo->StartingStep;
      local_4070 = &pHokuyo->FrontStep;
      local_4068 = &pHokuyo->EndStep;
      local_4060 = &pHokuyo->ClusterCount;
      local_4058 = &pHokuyo->ScanInterval;
      local_4050 = &pHokuyo->bContinuousNumberOfScans;
      local_4048 = &pHokuyo->alpha_max_err;
      local_4040 = &pHokuyo->d_max_err;
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c840c;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c840c:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%255s",pHokuyo->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c848b;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c848b:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",&pHokuyo->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c850a;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c850a:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",&pHokuyo->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c8589;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c8589:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",local_40a0);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c860d;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c860d:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",local_4098);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c8691;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c8691:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",local_4090);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c8715;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c8715:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",local_4088);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c8799;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c8799:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",local_4080);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c881d;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c881d:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",local_4078);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c88a1;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c88a1:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",local_4070);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c8925;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c8925:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",local_4068);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c89a9;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c89a9:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",local_4060);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c8a2d;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c8a2d:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",local_4058);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c8ab1;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c8ab1:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%d",local_4050);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c8b35;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c8b35:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%lf",local_4048);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_41a8,0x100,__stream), local_41a8 != '#' && (local_41a8 != '%')
               )) {
          if ((local_41a8 != '/') || ((pcVar2 == (char *)0x0 || (local_41a7 != '/'))))
          goto LAB_001c8bb9;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001c8bb9:
      if (pcVar2 == (char *)0x0 || local_41a8 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_41a8,"%lf",local_4040);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_001c8c22;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_001c8c22:
  if (pHokuyo->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pHokuyo->threadperiod = 100;
  }
  if (pHokuyo->SlitDivision < 1) {
    puts("Invalid parameter : SlitDivision.");
    pHokuyo->SlitDivision = 0x400;
  }
  if (pHokuyo->ClusterCount < 0) {
    puts("Invalid parameter : ClusterCount.");
    pHokuyo->ClusterCount = 0;
  }
  iVar1 = pHokuyo->ClusterCount + 1;
  pHokuyo->StepAngleSize = ((double)iVar1 * 360.0) / (double)pHokuyo->SlitDivision;
  pHokuyo->StepCount = ((pHokuyo->EndStep - pHokuyo->StartingStep) + 1) / iVar1;
  iVar1 = OpenRS232Port(&pHokuyo->RS232Port,pHokuyo->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a Hokuyo.");
    return 1;
  }
  iVar1 = (pHokuyo->RS232Port).DevType;
  if (3 < iVar1 - 1U) {
    if ((iVar1 == 0) &&
       (iVar1 = SetOptionsComputerRS232Port
                          ((pHokuyo->RS232Port).hDev,pHokuyo->BaudRate,'\0',0,'\b','\0',
                           pHokuyo->timeout), iVar1 == 0)) {
      tcflush(*(int *)&(pHokuyo->RS232Port).hDev,2);
      goto LAB_001c8cf7;
    }
LAB_001c8ec1:
    pcVar2 = "Unable to connect to a Hokuyo.";
    goto LAB_001c9030;
  }
LAB_001c8cf7:
  if (pHokuyo->bForceSCIP20 != 0) {
    memset(local_202f,0,0x1ff7);
    local_2038 = 0xa302e3250494353;
    local_2030 = 0;
    sVar3 = strlen((char *)&local_2038);
    iVar1 = (pHokuyo->RS232Port).DevType;
    uVar7 = (uint)sVar3;
    if (iVar1 - 1U < 4) {
      if (0 < (int)uVar7) {
        iVar1 = (pHokuyo->RS232Port).s;
        uVar6 = 0;
        do {
          sVar4 = send(iVar1,(void *)((long)&local_2038 + uVar6),(long)(int)(uVar7 - (int)uVar6),0);
          if ((int)sVar4 < 1) goto LAB_001c8ec1;
          uVar5 = (int)uVar6 + (int)sVar4;
          uVar6 = (ulong)uVar5;
        } while ((int)uVar5 < (int)uVar7);
      }
    }
    else {
      if (iVar1 != 0) goto LAB_001c8ec1;
      if (uVar7 != 0) {
        iVar1 = *(int *)&(pHokuyo->RS232Port).hDev;
        uVar6 = 0;
        do {
          sVar4 = write(iVar1,(void *)((long)&local_2038 + uVar6),(ulong)(uVar7 - (int)uVar6));
          if ((int)sVar4 < 1) goto LAB_001c8ec1;
          uVar5 = (int)uVar6 + (int)sVar4;
          uVar6 = (ulong)uVar5;
        } while (uVar5 < uVar7);
      }
    }
    uVar6 = 0;
    memset(&local_4038,0,0x2000);
    iVar1 = (pHokuyo->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      iVar1 = (pHokuyo->RS232Port).s;
      do {
        sVar4 = recv(iVar1,(void *)((long)&local_4038 + uVar6),(long)(0xc - (int)uVar6),0);
        if ((int)sVar4 < 1) goto LAB_001c8ec1;
        uVar7 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar7;
      } while ((int)uVar7 < 0xc);
    }
    else {
      if (iVar1 != 0) goto LAB_001c8ec1;
      iVar1 = *(int *)&(pHokuyo->RS232Port).hDev;
      uVar6 = 0;
      do {
        sVar4 = read(iVar1,(void *)((long)&local_4038 + uVar6),(ulong)(0xc - (int)uVar6));
        if ((int)sVar4 < 1) goto LAB_001c8ec1;
        uVar7 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar7;
      } while (uVar7 < 0xc);
    }
    if (CONCAT44(uStack_402f,uStack_4033) != 0xa0a30300a302e ||
        CONCAT35((undefined3)uStack_4033,local_4038) != 0xa302e3250494353) goto LAB_001c8ec1;
  }
  memset(&local_2038,0,0x2000);
  local_2038 = CONCAT44(local_2038._4_4_,0xa5352);
  sVar3 = strlen((char *)&local_2038);
  iVar1 = (pHokuyo->RS232Port).DevType;
  uVar7 = (uint)sVar3;
  if (iVar1 - 1U < 4) {
    if (0 < (int)uVar7) {
      iVar1 = (pHokuyo->RS232Port).s;
      uVar6 = 0;
      do {
        sVar4 = send(iVar1,(void *)((long)&local_2038 + uVar6),(long)(int)(uVar7 - (int)uVar6),0);
        if ((int)sVar4 < 1) goto LAB_001c9029;
        uVar5 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar5;
      } while ((int)uVar5 < (int)uVar7);
    }
LAB_001c8f7e:
    uVar6 = 0;
    memset(&local_4038,0,0x2000);
    iVar1 = (pHokuyo->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      iVar1 = (pHokuyo->RS232Port).s;
      do {
        sVar4 = recv(iVar1,(void *)((long)&local_4038 + uVar6),(long)(8 - (int)uVar6),0);
        if ((int)sVar4 < 1) goto LAB_001c9029;
        uVar7 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar7;
      } while ((int)uVar7 < 8);
    }
    else {
      if (iVar1 != 0) goto LAB_001c9029;
      iVar1 = *(int *)&(pHokuyo->RS232Port).hDev;
      uVar6 = 0;
      do {
        sVar4 = read(iVar1,(void *)((long)&local_4038 + uVar6),(ulong)(8 - (int)uVar6));
        if ((int)sVar4 < 1) goto LAB_001c9029;
        uVar7 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar7;
      } while (uVar7 < 8);
    }
    if (uStack_4033._3_1_ == '\0' &&
        CONCAT35((undefined3)uStack_4033,local_4038) == 0xa0a5030300a5352) {
      memset(&local_2038,0,0x2000);
      local_2038 = CONCAT44(local_2038._4_4_,0xa4d42);
      sVar3 = strlen((char *)&local_2038);
      iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&local_2038,(int)sVar3);
      if (iVar1 == 0) {
        memset(&local_4038,0,0x2000);
        iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&local_4038,8);
        if ((iVar1 == 0) && (iVar1 = __isoc99_sscanf(&local_4038), iVar1 == 2)) {
          if (pHokuyo->bHS == 0) {
LAB_001c91c3:
            memset(&local_2038,0,0x2000);
            sprintf((char *)&local_2038,"MD%04d%04d%02d%01d00\n",(ulong)(uint)pHokuyo->StartingStep,
                    (ulong)(uint)pHokuyo->EndStep,(ulong)(uint)pHokuyo->ClusterCount,
                    (ulong)(uint)pHokuyo->ScanInterval);
            sVar3 = strlen((char *)&local_2038);
            iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&local_2038,(int)sVar3);
            if (iVar1 == 0) {
              memset(&local_4038,0,0x2000);
              iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&local_4038,0x15);
              if (iVar1 == 0) {
                local_41ac = 0;
                iVar1 = __isoc99_sscanf(&local_4038,"MD%04d%04d%02d%01d%02d\n00P\n\n",&local_41ac,
                                        &local_41ac,&local_41ac,&local_41ac,&local_41ac);
                if (iVar1 == 5) {
                  puts("Hokuyo connected.");
                  return 0;
                }
              }
            }
            pcVar2 = "Unable to connect to a Hokuyo : MD command failure.";
          }
          else {
            memset((void *)((long)&local_2038 + 5),0,0x1ffb);
            local_2038 = CONCAT35(local_2038._5_3_,0xa315348);
            sVar3 = strlen((char *)&local_2038);
            iVar1 = WriteAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&local_2038,(int)sVar3);
            if (iVar1 == 0) {
              memset(&local_4038,0,0x2000);
              iVar1 = ReadAllRS232Port(&pHokuyo->RS232Port,(uint8 *)&local_4038,9);
              if (iVar1 == 0) {
                local_41ac = 0;
                iVar1 = __isoc99_sscanf(&local_4038);
                if (iVar1 == 3) goto LAB_001c91c3;
              }
            }
            pcVar2 = "Unable to connect to a Hokuyo : HS command failure.";
          }
          goto LAB_001c9030;
        }
      }
      pcVar2 = "Unable to connect to a Hokuyo : BM command failure.";
      goto LAB_001c9030;
    }
  }
  else if (iVar1 == 0) {
    if (uVar7 != 0) {
      iVar1 = *(int *)&(pHokuyo->RS232Port).hDev;
      uVar6 = 0;
      do {
        sVar4 = write(iVar1,(void *)((long)&local_2038 + uVar6),(ulong)(uVar7 - (int)uVar6));
        if ((int)sVar4 < 1) goto LAB_001c9029;
        uVar5 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar5;
      } while (uVar5 < uVar7);
    }
    goto LAB_001c8f7e;
  }
LAB_001c9029:
  pcVar2 = "Unable to connect to a Hokuyo : RS command failure.";
LAB_001c9030:
  puts(pcVar2);
  CloseRS232Port(&pHokuyo->RS232Port);
  return 1;
}

Assistant:

inline int ConnectHokuyo(HOKUYO* pHokuyo, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char sendbuf[MAX_NB_BYTES_HOKUYO];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_HOKUYO];
	int recvbuflen = 0;
	int ivalue = 0, Status = 0;
	char Sum = 0;

	memset(pHokuyo->szCfgFilePath, 0, sizeof(pHokuyo->szCfgFilePath));
	sprintf(pHokuyo->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pHokuyo->szDevPath, 0, sizeof(pHokuyo->szDevPath));
		sprintf(pHokuyo->szDevPath, "COM1");
		pHokuyo->BaudRate = 115200;
		pHokuyo->timeout = 1000;
		pHokuyo->threadperiod = 100;
		pHokuyo->bSaveRawData = 1;
		pHokuyo->bForceSCIP20 = 0;
		pHokuyo->bHS = 0;
		pHokuyo->SlitDivision = 1024;
		pHokuyo->StartingStep = 44;
		pHokuyo->FrontStep = 384;
		pHokuyo->EndStep = 725;
		pHokuyo->ClusterCount = 0;
		pHokuyo->ScanInterval = 0;
		pHokuyo->bContinuousNumberOfScans = 1;
		pHokuyo->alpha_max_err = 0.01;
		pHokuyo->d_max_err = 0.1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pHokuyo->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bForceSCIP20) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bHS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->SlitDivision) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->StartingStep) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->FrontStep) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->EndStep) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->ClusterCount) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->ScanInterval) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pHokuyo->bContinuousNumberOfScans) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pHokuyo->alpha_max_err) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pHokuyo->d_max_err) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pHokuyo->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pHokuyo->threadperiod = 100;
	}
	if (pHokuyo->SlitDivision <= 0)
	{
		printf("Invalid parameter : SlitDivision.\n");
		pHokuyo->SlitDivision = 1024;
	}
	if (pHokuyo->ClusterCount < 0)
	{
		printf("Invalid parameter : ClusterCount.\n");
		pHokuyo->ClusterCount = 0;
	}
		
	pHokuyo->StepAngleSize = 360.0*(pHokuyo->ClusterCount+1)/pHokuyo->SlitDivision;
	pHokuyo->StepCount = (pHokuyo->EndStep-pHokuyo->StartingStep+1)/(pHokuyo->ClusterCount+1);

	// Used to save raw data, should be handled specifically...
	//pHokuyo->pfSaveFile = NULL;

	if (OpenRS232Port(&pHokuyo->RS232Port, pHokuyo->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pHokuyo->RS232Port, pHokuyo->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pHokuyo->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	if (pHokuyo->bForceSCIP20)
	{	
		// Force SCIP2.0 mode.

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		strcpy(sendbuf, "SCIP2.0\n");
		sendbuflen = (int)strlen(sendbuf);

		if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 12;

		if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Check response.
		if (strcmp(recvbuf, "SCIP2.0\n00\n\n") != 0)
		{
			printf("Unable to connect to a Hokuyo.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}
	}
	
	// RS command to reset.
	
	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	strcpy(sendbuf, "RS\n");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : RS command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
		
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 8;

	if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : RS command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	// Check response.
	if (strcmp(recvbuf, "RS\n00P\n\n") != 0)
	{
		printf("Unable to connect to a Hokuyo : RS command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	// BM command to switch on the laser.

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	strcpy(sendbuf, "BM\n");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : BM command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
		
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 8;

	if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Hokuyo : BM command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}

	// Check response.
	Status = 0; Sum = 0;
	if ((sscanf(recvbuf, "BM\n%02d%c\n\n", &Status, &Sum) != 2)||((Status != 0)&&(Status != 2)))
	{
		printf("Unable to connect to a Hokuyo : BM command failure.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
	
	if (pHokuyo->bHS)
	{
		// HS command to activate high sensitivity if available.

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		strcpy(sendbuf, "HS1\n");
		sendbuflen = (int)strlen(sendbuf);

		if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : HS command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 9;

		if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : HS command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Check response.
		ivalue = 0; Status = 0; Sum = 0;
		if ((sscanf(recvbuf, "HS%01d\n%02d%c\n\n", &ivalue, &Status, &Sum) != 3)||((Status != 0)&&(Status != 2)))
		{
			printf("Unable to connect to a Hokuyo : HS command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}
	}

	// Other mode not yet handled...

	//if (pHokuyo->bContinuousNumberOfScans)
	{
		// MD command to start data acquisition.

		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		sprintf(sendbuf, "MD%04d%04d%02d%01d00\n", pHokuyo->StartingStep, pHokuyo->EndStep, pHokuyo->ClusterCount, pHokuyo->ScanInterval);
		sendbuflen = (int)strlen(sendbuf);

		if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : MD command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = 21;

		if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a Hokuyo : MD command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// Check response.
		ivalue = 0;
		if (sscanf(recvbuf, "MD%04d%04d%02d%01d%02d\n00P\n\n", &ivalue, &ivalue, &ivalue, &ivalue, &ivalue) != 5)
		{
			printf("Unable to connect to a Hokuyo : MD command failure.\n");
			CloseRS232Port(&pHokuyo->RS232Port);
			return EXIT_FAILURE;
		}

		// checking...
		// sscanf("echo...%02d%c\n\n", &Status, &Sum);
		// status == 0

	}
	
	printf("Hokuyo connected.\n");

	return EXIT_SUCCESS;
}